

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ReturnStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ReturnStatementSyntax,slang::syntax::ReturnStatementSyntax_const&>
          (BumpAllocator *this,ReturnStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  ReturnStatementSyntax *pRVar13;
  
  pRVar13 = (ReturnStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ReturnStatementSyntax *)this->endPtr < pRVar13 + 1) {
    pRVar13 = (ReturnStatementSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pRVar13 + 1);
  }
  (pRVar13->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pRVar13->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pRVar13->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pRVar13->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pRVar13->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pRVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pRVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pRVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar5;
  (pRVar13->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pRVar13->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pRVar13->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pRVar13->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pRVar13->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pRVar13->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  uVar6 = (args->returnKeyword).field_0x2;
  NVar7.raw = (args->returnKeyword).numFlags.raw;
  uVar8 = (args->returnKeyword).rawLen;
  pIVar3 = (args->returnKeyword).info;
  pEVar4 = args->returnValue;
  TVar9 = (args->semi).kind;
  uVar10 = (args->semi).field_0x2;
  NVar11.raw = (args->semi).numFlags.raw;
  uVar12 = (args->semi).rawLen;
  (pRVar13->returnKeyword).kind = (args->returnKeyword).kind;
  (pRVar13->returnKeyword).field_0x2 = uVar6;
  (pRVar13->returnKeyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pRVar13->returnKeyword).rawLen = uVar8;
  (pRVar13->returnKeyword).info = pIVar3;
  pRVar13->returnValue = pEVar4;
  (pRVar13->semi).kind = TVar9;
  (pRVar13->semi).field_0x2 = uVar10;
  (pRVar13->semi).numFlags = (NumericTokenFlags)NVar11.raw;
  (pRVar13->semi).rawLen = uVar12;
  (pRVar13->semi).info = (args->semi).info;
  return pRVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }